

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O2

float WindowingEnergy(float *window,float *data,size_t length,float *data_windowed)

{
  size_t i;
  size_t sVar1;
  float energy;
  float fVar2;
  
  energy = 0.0;
  for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
    fVar2 = window[sVar1] * data[sVar1];
    data_windowed[sVar1] = fVar2;
    energy = energy + fVar2 * fVar2;
  }
  return energy;
}

Assistant:

static float WindowingEnergy(const float *window, const float *data, size_t length, float *data_windowed) {
    size_t i;
    float energy = 0.f;
    for (i = 0; i < length; ++i) {
        data_windowed[i] = window[i] * data[i];
        energy += data_windowed[i] * data_windowed[i];
    }
    return energy;
}